

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> experiment<lcp64_experiment>(lcp64_experiment exp)

{
  unsigned_long *__src;
  unsigned_long uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  long lVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __position;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [64];
  undefined1 in_XMM2 [16];
  pair<unsigned_long,_unsigned_long> pVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> times;
  uint64_t timespan;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res;
  double local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  unsigned_long local_58;
  undefined8 local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  undefined1 extraout_var [56];
  
  uVar6 = 0;
  uVar8 = 0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (uVar6 != 500) {
    local_58 = 0;
    local_50 = uVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&local_58);
    sVar4 = lcp64_experiment::operator()((lcp64_experiment *)&stack0x00000008);
    lVar7 = 1000;
    local_48._M_impl.super__Vector_impl_data._M_finish[-1] = sVar4;
    lVar5 = std::chrono::_V2::system_clock::now();
    while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
      DoNotOptimizeAway<lcp64_experiment&>((lcp64_experiment *)&stack0x00000008);
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    local_58 = lVar7 - lVar5;
    __position = std::
                 __upper_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Val_less_iter>
                           (local_78._M_impl.super__Vector_impl_data._M_start,
                            local_78._M_impl.super__Vector_impl_data._M_finish,&local_58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (const_iterator)__position._M_current,&local_58);
    uVar6 = uVar6 + 1;
    if ((uVar6 & 3) == 0) {
      local_78._M_impl.super__Vector_impl_data._M_finish =
           local_78._M_impl.super__Vector_impl_data._M_finish + -1;
      __src = local_78._M_impl.super__Vector_impl_data._M_start + 1;
      if (__src != local_78._M_impl.super__Vector_impl_data._M_finish) {
        memmove(local_78._M_impl.super__Vector_impl_data._M_start,__src,
                (long)local_78._M_impl.super__Vector_impl_data._M_finish - (long)__src);
      }
      local_78._M_impl.super__Vector_impl_data._M_finish =
           local_78._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    if (400 < (ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78._M_impl.super__Vector_impl_data._M_start)) {
      local_80 = packed::math::arithmetic_mean<unsigned_long>
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
      dVar10 = packed::math::deviation<unsigned_long>
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                          &local_80);
      if ((dVar10 < 10.0) || (auVar3 = vcvtusi2sd_avx512f(in_XMM2,local_50), dVar10 < auVar3._0_8_))
      break;
    }
    local_80 = packed::math::arithmetic_mean<unsigned_long>
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
    auVar11._0_8_ =
         packed::math::deviation<unsigned_long>
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,&local_80);
    auVar11._8_56_ = extraout_var;
    uVar8 = vcvttsd2usi_avx512f(auVar11._0_16_);
  }
  uVar1 = *local_78._M_impl.super__Vector_impl_data._M_start;
  uVar2 = local_78._M_impl.super__Vector_impl_data._M_finish[-1];
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  pVar12.second = uVar2;
  pVar12.first = uVar1;
  return pVar12;
}

Assistant:

std::pair<size_t,size_t> experiment(experiment_type exp) {

    std::vector<uint64_t> times;
    std::vector<uint64_t> res;
    uint64_t prev_deviation = 0;

    for(size_t i = 0; i < MAX_SAMPLES; ++i) {
      res.push_back(0);

      res.back() = exp();

      using time_point = std::chrono::high_resolution_clock::time_point;
      time_point t1 = std::chrono::high_resolution_clock::now();

      for(size_t j = 0; j < MEASUREMENTS; ++j) {
	DoNotOptimizeAway(exp);
      }

      time_point t2 = std::chrono::high_resolution_clock::now();

      const uint64_t timespan = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1).count();

      times.insert(std::upper_bound(times.begin(), times.end(), timespan), timespan);

      if( (i+1) % 4 == 0) {
	times.pop_back();
	times.erase(times.begin());
      }
      if(times.size() > MIN_SAMPLES) {
	double deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
	if(deviation < MIN_DEVIATION) break;
	if(prev_deviation > deviation) break;
      }
      prev_deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
    }
    // std::cout << "len " << length << " means " << math::arithmetic_mean(times) << " dev: " << math::deviation(times, math::arithmetic_mean(times)) << "LCE " << res.back() << std::endl;
    return std::make_pair(times[0], times.back());
}